

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_statements.cpp
# Opt level: O2

StatementSyntax * __thiscall
slang::parsing::Parser::parseRandSequenceStatement
          (Parser *this,NamedLabelSyntax *label,AttrList attributes)

{
  SyntaxNode *pSVar1;
  bool bVar2;
  int iVar3;
  ProductionSyntax *pPVar4;
  SourceLocation location;
  undefined4 extraout_var;
  RandSequenceStatementSyntax *pRVar5;
  Token randsequence;
  Token openParen;
  Token firstProduction;
  Token closeParen;
  Token TVar6;
  Token TVar7;
  Token local_e0;
  SyntaxNode *local_d0;
  SyntaxNode *pSStack_c8;
  size_t local_c0;
  pointer local_b8;
  __extent_storage<18446744073709551615UL> local_b0;
  SmallVector<slang::syntax::ProductionSyntax_*,_5UL> productions;
  SyntaxList<slang::syntax::ProductionSyntax> local_68;
  
  randsequence = ParserBase::consume(&this->super_ParserBase);
  openParen = ParserBase::expect(&this->super_ParserBase,OpenParenthesis);
  firstProduction = ParserBase::consumeIf(&this->super_ParserBase,Identifier);
  closeParen = ParserBase::expect(&this->super_ParserBase,CloseParenthesis);
  productions.super_SmallVectorBase<slang::syntax::ProductionSyntax_*>.data_ =
       (pointer)productions.super_SmallVectorBase<slang::syntax::ProductionSyntax_*>.firstElement;
  productions.super_SmallVectorBase<slang::syntax::ProductionSyntax_*>.len = 0;
  productions.super_SmallVectorBase<slang::syntax::ProductionSyntax_*>.cap = 5;
  while( true ) {
    TVar6 = ParserBase::peek(&this->super_ParserBase);
    bVar2 = syntax::SyntaxFacts::isPossibleDataType(TVar6.kind);
    if (!bVar2) break;
    TVar6 = ParserBase::peek(&this->super_ParserBase);
    pPVar4 = parseProduction(this);
    local_e0._0_8_ = pPVar4;
    SmallVectorBase<slang::syntax::ProductionSyntax*>::
    emplace_back<slang::syntax::ProductionSyntax*>
              ((SmallVectorBase<slang::syntax::ProductionSyntax*> *)&productions,
               (ProductionSyntax **)&local_e0);
    pSVar1 = this->previewNode;
    this->previewNode = (SyntaxNode *)0x0;
    (productions.super_SmallVectorBase<slang::syntax::ProductionSyntax_*>.data_
     [productions.super_SmallVectorBase<slang::syntax::ProductionSyntax_*>.len - 1]->
    super_SyntaxNode).previewNode = pSVar1;
    TVar7 = ParserBase::peek(&this->super_ParserBase);
    if (TVar6.info == TVar7.info && TVar6.kind == TVar7.kind) {
      ParserBase::skipToken(&this->super_ParserBase,(optional<slang::DiagCode>)0x0);
    }
  }
  if (productions.super_SmallVectorBase<slang::syntax::ProductionSyntax_*>.len == 0) {
    local_e0 = ParserBase::peek(&this->super_ParserBase);
    location = Token::location(&local_e0);
    ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x4f0005,location);
  }
  TVar6 = ParserBase::expect(&this->super_ParserBase,EndSequenceKeyword);
  local_e0.info._0_4_ = 1;
  local_d0 = (SyntaxNode *)0x0;
  pSStack_c8 = (SyntaxNode *)0x0;
  local_e0._0_8_ = &PTR_getChild_002da628;
  local_c0 = attributes._M_extent._M_extent_value._M_extent_value;
  local_b8 = attributes._M_ptr;
  local_b0._M_extent_value = attributes._M_extent._M_extent_value._M_extent_value;
  iVar3 = SmallVectorBase<slang::syntax::ProductionSyntax_*>::copy
                    (&productions.super_SmallVectorBase<slang::syntax::ProductionSyntax_*>,
                     (EVP_PKEY_CTX *)(this->super_ParserBase).alloc,(EVP_PKEY_CTX *)TVar6.info);
  local_68.super_span<slang::syntax::ProductionSyntax_*,_18446744073709551615UL>._M_ptr =
       (pointer)CONCAT44(extraout_var,iVar3);
  local_68.super_SyntaxListBase.super_SyntaxNode.kind = SyntaxList;
  local_68.super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)0x0;
  local_68.super_SyntaxListBase.super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
  local_68.super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_002dba18;
  pRVar5 = syntax::SyntaxFactory::randSequenceStatement
                     (&this->factory,label,
                      (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)&local_e0,randsequence,
                      openParen,firstProduction,closeParen,&local_68,TVar6);
  SmallVectorBase<slang::syntax::ProductionSyntax_*>::cleanup
            (&productions.super_SmallVectorBase<slang::syntax::ProductionSyntax_*>,
             (EVP_PKEY_CTX *)label);
  return &pRVar5->super_StatementSyntax;
}

Assistant:

StatementSyntax& Parser::parseRandSequenceStatement(NamedLabelSyntax* label, AttrList attributes) {
    auto keyword = consume();
    auto openParen = expect(TokenKind::OpenParenthesis);
    auto firstProd = consumeIf(TokenKind::Identifier);
    auto closeParen = expect(TokenKind::CloseParenthesis);

    SmallVector<ProductionSyntax*> productions;
    while (isPossibleDataType(peek().kind)) {
        auto curr = peek();
        productions.push_back(&parseProduction());
        productions.back()->previewNode = std::exchange(previewNode, nullptr);

        // If there are no consumed tokens then production was not parsed.
        if (curr == peek())
            skipToken(std::nullopt);
    }

    if (productions.empty())
        addDiag(diag::ExpectedRsRule, peek().location());

    auto endsequence = expect(TokenKind::EndSequenceKeyword);
    return factory.randSequenceStatement(label, attributes, keyword, openParen, firstProd,
                                         closeParen, productions.copy(alloc), endsequence);
}